

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O3

const_iterator __thiscall
r_code::list<r_exec::MDLController::REntry>::erase
          (list<r_exec::MDLController::REntry> *this,const_iterator *i)

{
  long lVar1;
  pointer pcVar2;
  long lVar3;
  _iterator _Var4;
  pointer pcVar5;
  int64_t *piVar6;
  const_iterator cVar7;
  
  lVar1 = (i->super__iterator)._cell;
  pcVar2 = (this->cells).
           super__Vector_base<r_code::list<r_exec::MDLController::REntry>::cell,_std::allocator<r_code::list<r_exec::MDLController::REntry>::cell>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = pcVar2[lVar1].prev;
  pcVar5 = pcVar2 + lVar3;
  if (lVar3 == -1) {
    pcVar5 = (pointer)&this->used_cells_head;
  }
  _Var4._cell = pcVar2[lVar1].next;
  piVar6 = &pcVar2[_Var4._cell].prev;
  if (_Var4._cell == -1) {
    piVar6 = &this->used_cells_tail;
  }
  pcVar5->next = _Var4._cell;
  *piVar6 = lVar3;
  pcVar2[lVar1].next = this->free_cells;
  this->free_cells = lVar1;
  this->used_cell_count = this->used_cell_count - 1;
  this->free_cell_count = this->free_cell_count + 1;
  cVar7._list = this;
  cVar7.super__iterator._cell = _Var4._cell;
  return cVar7;
}

Assistant:

const_iterator erase(const_iterator &i)
    {
        return const_iterator(this, _erase(i._cell)); // no check for i._cell==null.
    }